

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferVAOAttacher::initAttachment
          (BufferVAOAttacher *this,GLuint seed,GLuint buffer)

{
  Functions *gl;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  ContextWrapper *this_01;
  double __x;
  MessageBuilder local_198;
  GLuint local_18;
  GLuint local_14;
  GLuint buffer_local;
  GLuint seed_local;
  BufferVAOAttacher *this_local;
  
  this_01 = &(this->super_Attacher).super_ContextWrapper;
  local_18 = buffer;
  local_14 = seed;
  _buffer_local = this;
  gl = deqp::gls::LifetimeTests::details::ContextWrapper::gl(this_01);
  initBuffer(gl,local_14,0x88e4,local_18);
  deqp::gls::LifetimeTests::details::ContextWrapper::log(this_01,__x);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [23])"// Initialized buffer ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_18);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])" from seed ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_14);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return;
}

Assistant:

void BufferVAOAttacher::initAttachment (GLuint seed, GLuint buffer)
{
	initBuffer(gl(), seed, GL_STATIC_DRAW, buffer);
	log() << TestLog::Message << "// Initialized buffer " << buffer << " from seed " << seed
		  << TestLog::EndMessage;
}